

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Cluster.c
# Opt level: O2

float Llb_ManComputeCommonAttr(Llb_Mtr_t *p,int iCol1,int iCol2)

{
  char cVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  
  uVar2 = p->nRows - p->nFfs;
  uVar4 = 0;
  uVar3 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar3 = uVar4;
  }
  iVar5 = 0;
  iVar6 = 0;
  do {
    if (uVar3 == uVar4) {
      return -(float)iVar6 / (float)(iVar5 + iVar6);
    }
    cVar1 = p->pMatrix[iCol2][uVar4];
    if (p->pMatrix[iCol1][uVar4] == '\x01') {
      if (cVar1 == '\x01') {
        iVar5 = iVar5 + 1;
      }
      else {
LAB_0074e344:
        iVar6 = iVar6 + 1;
      }
    }
    else if (cVar1 == '\x01') goto LAB_0074e344;
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

float Llb_ManComputeCommonAttr( Llb_Mtr_t * p, int iCol1, int iCol2 )
{
    int iVar, CountComm = 0, CountDiff = 0;
    for ( iVar = 0; iVar < p->nRows - p->nFfs; iVar++ )
    {
        if ( p->pMatrix[iCol1][iVar] == 1 && p->pMatrix[iCol2][iVar] == 1 )
            CountComm++;
        else if ( p->pMatrix[iCol1][iVar] == 1 || p->pMatrix[iCol2][iVar] == 1 )
            CountDiff++;
    }
/*
    printf( "Attr cost for %4d and %4d:  %4d %4d (%5.2f)\n", 
        iCol1, iCol2, 
        CountDiff, CountComm, 
        -1.0 * CountDiff / ( CountComm + CountDiff ) );
*/
    return -1.0 * CountDiff / ( CountComm + CountDiff );
}